

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRule.c
# Opt level: O0

Vec_Int_t * Amap_CreateRulesVector_rec(Amap_Lib_t *p,Vec_Ptr_t *vVecNods,int fXor)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  void *pvVar5;
  Vec_Int_t *pVVar6;
  int local_60;
  int Limit;
  int k;
  int i;
  Vec_Int_t *vNods1;
  Vec_Int_t *vNods0;
  Vec_Int_t *vNods;
  Vec_Int_t *vRes;
  Vec_Ptr_t *vVecNods1;
  Vec_Ptr_t *vVecNods0;
  int fXor_local;
  Vec_Ptr_t *vVecNods_local;
  Amap_Lib_t *p_local;
  
  iVar1 = Vec_PtrSize(vVecNods);
  if (iVar1 == 1) {
    pVVar4 = (Vec_Int_t *)Vec_PtrEntry(vVecNods,0);
    p_local = (Amap_Lib_t *)Vec_IntDup(pVVar4);
  }
  else {
    p_local = (Amap_Lib_t *)Vec_IntAlloc(10);
    iVar1 = Vec_PtrSize(vVecNods);
    p_00 = Vec_PtrAlloc(iVar1);
    iVar1 = Vec_PtrSize(vVecNods);
    p_01 = Vec_PtrAlloc(iVar1);
    iVar1 = Amap_CreateCheckAllZero(vVecNods);
    if (iVar1 == 0) {
      iVar1 = Vec_PtrSize(vVecNods);
      for (Limit = 1; Limit < (1 << ((byte)iVar1 & 0x1f)) + -2; Limit = Limit + 1) {
        Vec_PtrClear(p_00);
        Vec_PtrClear(p_01);
        local_60 = Vec_PtrSize(vVecNods);
        while (local_60 = local_60 + -1, -1 < local_60) {
          pvVar5 = Vec_PtrEntry(vVecNods,local_60);
          if ((Limit & 1 << ((byte)local_60 & 0x1f)) == 0) {
            Vec_PtrPush(p_00,pvVar5);
          }
          else {
            Vec_PtrPush(p_01,pvVar5);
          }
        }
        iVar2 = Vec_PtrSize(p_00);
        if (iVar2 < 1) {
          __assert_fail("Vec_PtrSize(vVecNods0) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                        ,0xa4,
                        "Vec_Int_t *Amap_CreateRulesVector_rec(Amap_Lib_t *, Vec_Ptr_t *, int)");
        }
        iVar2 = Vec_PtrSize(p_01);
        if (iVar2 < 1) {
          __assert_fail("Vec_PtrSize(vVecNods1) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                        ,0xa5,
                        "Vec_Int_t *Amap_CreateRulesVector_rec(Amap_Lib_t *, Vec_Ptr_t *, int)");
        }
        iVar2 = Vec_PtrSize(p_00);
        iVar3 = Vec_PtrSize(vVecNods);
        if (iVar3 <= iVar2) {
          __assert_fail("Vec_PtrSize(vVecNods0) < Vec_PtrSize(vVecNods)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                        ,0xa6,
                        "Vec_Int_t *Amap_CreateRulesVector_rec(Amap_Lib_t *, Vec_Ptr_t *, int)");
        }
        iVar2 = Vec_PtrSize(p_01);
        iVar3 = Vec_PtrSize(vVecNods);
        if (iVar3 <= iVar2) {
          __assert_fail("Vec_PtrSize(vVecNods1) < Vec_PtrSize(vVecNods)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                        ,0xa7,
                        "Vec_Int_t *Amap_CreateRulesVector_rec(Amap_Lib_t *, Vec_Ptr_t *, int)");
        }
        pVVar4 = Amap_CreateRulesVector_rec(p,p_00,fXor);
        pVVar6 = Amap_CreateRulesVector_rec(p,p_01,fXor);
        Amap_CreateRulesTwo(p,(Vec_Int_t *)p_local,pVVar4,pVVar6,fXor);
        Vec_IntFree(pVVar4);
        Vec_IntFree(pVVar6);
      }
    }
    else {
      Limit = Vec_PtrSize(vVecNods);
      while (Limit = Limit + -1, 0 < Limit) {
        Vec_PtrClear(p_00);
        Vec_PtrClear(p_01);
        for (local_60 = 0; local_60 < Limit; local_60 = local_60 + 1) {
          pvVar5 = Vec_PtrEntry(vVecNods,local_60);
          Vec_PtrPush(p_00,pvVar5);
        }
        for (local_60 = Limit; iVar1 = Vec_PtrSize(vVecNods), local_60 < iVar1;
            local_60 = local_60 + 1) {
          pvVar5 = Vec_PtrEntry(vVecNods,local_60);
          Vec_PtrPush(p_01,pvVar5);
        }
        pVVar4 = Amap_CreateRulesVector_rec(p,p_00,fXor);
        pVVar6 = Amap_CreateRulesVector_rec(p,p_01,fXor);
        Amap_CreateRulesTwo(p,(Vec_Int_t *)p_local,pVVar4,pVVar6,fXor);
        Vec_IntFree(pVVar4);
        Vec_IntFree(pVVar6);
      }
    }
    Vec_PtrFree(p_00);
    Vec_PtrFree(p_01);
  }
  return (Vec_Int_t *)p_local;
}

Assistant:

Vec_Int_t * Amap_CreateRulesVector_rec( Amap_Lib_t * p, Vec_Ptr_t * vVecNods, int fXor )
{
    Vec_Ptr_t * vVecNods0, * vVecNods1;
    Vec_Int_t * vRes, * vNods, * vNods0, * vNods1;
    int i, k;
    if ( Vec_PtrSize(vVecNods) == 1 )
        return Vec_IntDup( (Vec_Int_t *)Vec_PtrEntry(vVecNods, 0) );
    vRes = Vec_IntAlloc( 10 );
    vVecNods0 = Vec_PtrAlloc( Vec_PtrSize(vVecNods) );
    vVecNods1 = Vec_PtrAlloc( Vec_PtrSize(vVecNods) );
    if ( Amap_CreateCheckAllZero(vVecNods) )
    {
        for ( i = Vec_PtrSize(vVecNods)-1; i > 0; i-- )
        {
            Vec_PtrClear( vVecNods0 );
            Vec_PtrClear( vVecNods1 );
            Vec_PtrForEachEntryStop( Vec_Int_t *, vVecNods, vNods, k, i )
                Vec_PtrPush( vVecNods0, vNods );
            Vec_PtrForEachEntryStart( Vec_Int_t *, vVecNods, vNods, k, i )
                Vec_PtrPush( vVecNods1, vNods );
            vNods0 = Amap_CreateRulesVector_rec( p, vVecNods0, fXor );
            vNods1 = Amap_CreateRulesVector_rec( p, vVecNods1, fXor );
            Amap_CreateRulesTwo( p, vRes, vNods0, vNods1, fXor );
            Vec_IntFree( vNods0 );
            Vec_IntFree( vNods1 );
        }
    }
    else
    {
        int Limit = (1 << Vec_PtrSize(vVecNods))-2;
        for ( i = 1; i < Limit; i++ )
        {
            Vec_PtrClear( vVecNods0 );
            Vec_PtrClear( vVecNods1 );
            Vec_PtrForEachEntryReverse( Vec_Int_t *, vVecNods, vNods, k )
            {
                if ( i & (1 << k) )
                    Vec_PtrPush( vVecNods1, vNods );
                else
                    Vec_PtrPush( vVecNods0, vNods );
            }
            assert( Vec_PtrSize(vVecNods0) > 0 );
            assert( Vec_PtrSize(vVecNods1) > 0 );
            assert( Vec_PtrSize(vVecNods0) < Vec_PtrSize(vVecNods) );
            assert( Vec_PtrSize(vVecNods1) < Vec_PtrSize(vVecNods) );
            vNods0 = Amap_CreateRulesVector_rec( p, vVecNods0, fXor );
            vNods1 = Amap_CreateRulesVector_rec( p, vVecNods1, fXor );
            Amap_CreateRulesTwo( p, vRes, vNods0, vNods1, fXor );
            Vec_IntFree( vNods0 );
            Vec_IntFree( vNods1 );
        }
    }
    Vec_PtrFree( vVecNods0 );
    Vec_PtrFree( vVecNods1 );
    return vRes;
}